

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_split.cpp
# Opt level: O2

void duckdb::StringSplitFunction(DataChunk *args,ExpressionState *state,Vector *result)

{
  bool bVar1;
  reference pvVar2;
  Vector *vector;
  ulong uVar3;
  idx_t iVar4;
  long lVar5;
  ulong uVar6;
  idx_t i;
  ulong row_idx;
  data_ptr_t pdVar7;
  idx_t *piVar8;
  idx_t size;
  string_t input;
  string_t delim;
  void *in_stack_ffffffffffffff08;
  StringSplitInput split_input;
  UnifiedVectorFormat delim_data;
  UnifiedVectorFormat input_data;
  
  UnifiedVectorFormat::UnifiedVectorFormat(&input_data);
  pvVar2 = vector<duckdb::Vector,_true>::get<true>(&args->data,0);
  Vector::ToUnifiedFormat(pvVar2,args->count,&input_data);
  UnifiedVectorFormat::UnifiedVectorFormat(&delim_data);
  pvVar2 = vector<duckdb::Vector,_true>::get<true>(&args->data,1);
  Vector::ToUnifiedFormat(pvVar2,args->count,&delim_data);
  Vector::SetVectorType(result,FLAT_VECTOR);
  ListVector::SetListSize(result,0);
  pdVar7 = result->data;
  vector = ListVector::GetEntry(result);
  FlatVector::VerifyFlatVector(result);
  piVar8 = (idx_t *)(pdVar7 + 8);
  size = 0;
  for (row_idx = 0; row_idx < args->count; row_idx = row_idx + 1) {
    uVar3 = row_idx;
    if ((input_data.sel)->sel_vector != (sel_t *)0x0) {
      uVar3 = (ulong)(input_data.sel)->sel_vector[row_idx];
    }
    uVar6 = row_idx;
    if ((delim_data.sel)->sel_vector != (sel_t *)0x0) {
      uVar6 = (ulong)(delim_data.sel)->sel_vector[row_idx];
    }
    if ((input_data.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
         (unsigned_long *)0x0) ||
       ((input_data.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask[uVar3 >> 6] >>
         (uVar3 & 0x3f) & 1) != 0)) {
      split_input.result_list = result;
      split_input.result_child = vector;
      split_input.offset = size;
      if ((delim_data.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
           (unsigned_long *)0x0) ||
         ((delim_data.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask[uVar6 >> 6]
           >> (uVar6 & 0x3f) & 1) != 0)) {
        input.value.pointer.ptr = (char *)*(undefined8 *)(delim_data.data + uVar6 * 0x10);
        input.value._0_8_ = *(undefined8 *)(input_data.data + uVar3 * 0x10 + 8);
        delim.value.pointer.ptr = (char *)&split_input;
        delim.value._0_8_ = *(undefined8 *)(delim_data.data + uVar6 * 0x10 + 8);
        iVar4 = StringSplitter::Split<duckdb::RegularStringSplit>
                          (*(StringSplitter **)(input_data.data + uVar3 * 0x10),input,delim,
                           (StringSplitInput *)0x0,in_stack_ffffffffffffff08);
      }
      else {
        lVar5 = uVar3 * 0x10;
        if ((ulong)*(uint *)(input_data.data + lVar5) < 0xd) {
          pdVar7 = input_data.data + lVar5 + 4;
        }
        else {
          pdVar7 = *(data_ptr_t *)(input_data.data + lVar5 + 8);
        }
        StringSplitInput::AddSplit
                  (&split_input,(char *)pdVar7,(ulong)*(uint *)(input_data.data + lVar5),0);
        iVar4 = 1;
      }
      *piVar8 = iVar4;
      piVar8[-1] = size;
      size = size + iVar4;
    }
    else {
      TemplatedValidityMask<unsigned_long>::SetInvalid
                (&(result->validity).super_TemplatedValidityMask<unsigned_long>,row_idx);
    }
    piVar8 = piVar8 + 2;
  }
  ListVector::SetListSize(result,size);
  bVar1 = DataChunk::AllConstant(args);
  if (bVar1) {
    Vector::SetVectorType(result,CONSTANT_VECTOR);
  }
  pvVar2 = vector<duckdb::Vector,_true>::get<true>(&args->data,0);
  StringVector::AddHeapReference(vector,pvVar2);
  UnifiedVectorFormat::~UnifiedVectorFormat(&delim_data);
  UnifiedVectorFormat::~UnifiedVectorFormat(&input_data);
  return;
}

Assistant:

static void StringSplitFunction(DataChunk &args, ExpressionState &state, Vector &result) {
	StringSplitExecutor<RegularStringSplit>(args, state, result, nullptr);
}